

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall
cmCacheManager::WritePropertyEntries(cmCacheManager *this,ostream *os,CacheIterator *i)

{
  char **this_00;
  CacheIterator *fout;
  char *pcVar1;
  allocator local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  string key;
  allocator local_89;
  undefined1 local_88 [8];
  string helpstring;
  allocator local_51;
  string local_50;
  char *local_30;
  char *value;
  char **p;
  CacheIterator *i_local;
  ostream *os_local;
  cmCacheManager *this_local;
  
  p = (char **)i;
  i_local = (CacheIterator *)os;
  os_local = (ostream *)this;
  for (value = (char *)PersistentProperties; this_00 = p, *(long *)value != 0; value = value + 8) {
    pcVar1 = *(char **)value;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
    pcVar1 = CacheIterator::GetProperty((CacheIterator *)this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_30 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = *(char **)value;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_88,pcVar1,&local_89);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      std::__cxx11::string::operator+=((string *)local_88," property for variable: ");
      CacheIterator::GetName_abi_cxx11_((string *)((long)&key.field_2 + 8),(CacheIterator *)p);
      std::__cxx11::string::operator+=((string *)local_88,(string *)(key.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
      OutputHelpString((ostream *)i_local,(string *)local_88);
      CacheIterator::GetName_abi_cxx11_((string *)local_d0,(CacheIterator *)p);
      std::__cxx11::string::operator+=((string *)local_d0,"-");
      std::__cxx11::string::operator+=((string *)local_d0,*(char **)value);
      OutputKey((ostream *)i_local,(string *)local_d0);
      std::operator<<((ostream *)i_local,":INTERNAL=");
      fout = i_local;
      pcVar1 = local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,pcVar1,&local_f1);
      OutputValue((ostream *)fout,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::operator<<((ostream *)i_local,"\n");
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os,
                                          CacheIterator const& i)
{
  for(const char** p = this->PersistentProperties; *p; ++p)
    {
    if(const char* value = i.GetProperty(*p))
      {
      std::string helpstring = *p;
      helpstring += " property for variable: ";
      helpstring += i.GetName();
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = i.GetName();
      key += "-";
      key += *p;
      this->OutputKey(os, key);
      os << ":INTERNAL=";
      this->OutputValue(os, value);
      os << "\n";
      }
    }
}